

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteStreamTest_AllLite29_Test::TestBody
          (LiteStreamTest_AllLite29_Test *this)

{
  bool bVar1;
  void *data_00;
  char *pcVar2;
  char *in_R9;
  string local_630;
  AssertHelper local_610;
  Message local_608;
  string_view local_600;
  bool local_5e9;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__1;
  Message local_5d0;
  int local_5c4;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_590;
  Message local_588;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_;
  CodedOutputStream output_stream;
  ArrayOutputStream array_stream;
  string data;
  size_t size;
  undefined1 local_4c0 [8];
  TestMapLite message2;
  TestMapLite message1;
  LiteStreamTest_AllLite29_Test *this_local;
  
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)local_4c0);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>
            ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  data.field_2._8_8_ =
       proto2_unittest::TestMapLite::ByteSizeLong
                 ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  std::__cxx11::string::string((string *)&array_stream.position_);
  std::__cxx11::string::resize((ulong)&array_stream.position_);
  data_00 = (void *)std::__cxx11::string::operator[]((ulong)&array_stream.position_);
  io::ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)&output_stream.start_count_,data_00,data.field_2._8_4_,1);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ArrayOutputStream,void>
            ((CodedOutputStream *)&gtest_ar_.message_,
             (ArrayOutputStream *)&output_stream.start_count_);
  MessageLite::SerializeWithCachedSizes
            ((MessageLite *)&message2.field_0._impl_._cached_size_,
             (CodedOutputStream *)&gtest_ar_.message_);
  bVar1 = io::CodedOutputStream::HadError((CodedOutputStream *)&gtest_ar_.message_);
  local_579 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_578,&local_579,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_578,
               (AssertionResult *)"output_stream.HadError()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2cd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_590,&local_588);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  local_5c4 = io::CodedOutputStream::ByteCount((CodedOutputStream *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_5c0,"size","output_stream.ByteCount()",
             (unsigned_long *)(data.field_2._M_local_buf + 8),&local_5c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&gtest_ar_.message_);
  io::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&output_stream.start_count_);
  local_600 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&array_stream.position_);
  local_5e9 = MessageLite::ParseFromString((MessageLite *)local_4c0,local_600);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5e8,&local_5e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_630,(internal *)local_5e8,(AssertionResult *)"message2.ParseFromString(data)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&local_630);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>((TestMapLite *)local_4c0);
  std::__cxx11::string::~string((string *)&array_stream.position_);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)local_4c0);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(LiteStreamTest, AllLite29) {
  {
    // Test the generated SerializeWithCachedSizes()
    proto2_unittest::TestMapLite message1, message2;
    MapTestUtil::SetMapFields(&message1);
    size_t size = message1.ByteSizeLong();
    std::string data;
    data.resize(size);
    {
      // Allow the output stream to buffer only one byte at a time.
      io::ArrayOutputStream array_stream(&data[0], size, 1);
      io::CodedOutputStream output_stream(&array_stream);
      message1.SerializeWithCachedSizes(&output_stream);
      EXPECT_FALSE(output_stream.HadError());
      EXPECT_EQ(size, output_stream.ByteCount());
    }
    EXPECT_TRUE(message2.ParseFromString(data));
    MapTestUtil::ExpectMapFieldsSet(message2);
  }
}